

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O0

uchar * __thiscall
CVmRun::eval_prop_val
          (CVmRun *this,int found,uint caller_ofs,vm_val_t *val,vm_obj_id_t self,
          vm_prop_id_t target_prop,vm_val_t *orig_target_obj,vm_obj_id_t defining_obj,uint argc,
          vm_rcdesc *rc)

{
  uint caller_ofs_00;
  int iVar1;
  CVmObject *pCVar2;
  vm_val_t *pvVar3;
  vm_val_t *in_RCX;
  ulong uVar4;
  uint in_EDX;
  int in_ESI;
  CVmRun *in_RDI;
  vm_obj_id_t in_R8D;
  vm_prop_id_t in_R9W;
  long in_stack_00000008;
  vm_obj_id_t in_stack_00000010;
  int in_stack_00000018;
  vm_val_t funcptr;
  vm_val_t *fp_1;
  vm_val_t *fp;
  uint in_stack_ffffffffffffff98;
  vm_obj_id_t in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  vm_obj_id_t in_stack_ffffffffffffffa4;
  pool_ofs_t ofs;
  vm_val_t local_48;
  vm_rcdesc *in_stack_ffffffffffffffc8;
  vm_val_t *pvVar5;
  vm_rcdesc *in_stack_ffffffffffffffd0;
  uint uVar6;
  undefined2 in_stack_ffffffffffffffd8;
  uint caller_ofs_01;
  uchar *local_8;
  
  if (in_ESI == 0) {
    CVmStack::discard(in_stack_00000018);
    vm_val_t::set_nil(&r0_);
    local_8 = entry_ptr_native_ + in_EDX;
  }
  else {
    caller_ofs_00 = in_RCX->typ - VM_DSTRING;
    uVar4 = (ulong)caller_ofs_00;
    switch(uVar4) {
    case 0:
      if (in_stack_00000018 != 0) {
        err_throw(0);
      }
      local_8 = disp_dstring(in_RDI,0,caller_ofs_00,in_stack_ffffffffffffffa4);
      break;
    default:
      if (in_stack_00000018 != 0) {
        err_throw(0);
      }
      r0_.typ = in_RCX->typ;
      r0_._4_4_ = *(undefined4 *)&in_RCX->field_0x4;
      r0_.val = in_RCX->val;
      local_8 = entry_ptr_native_ + in_EDX;
      break;
    case 2:
      pvVar3 = CVmStack::push(5);
      ofs = (pool_ofs_t)(uVar4 >> 0x20);
      pvVar5 = pvVar3 + 1;
      vm_val_t::set_propid(pvVar3,in_R9W);
      pvVar3 = pvVar5 + 1;
      vm_val_t::set_obj(pvVar5,*(vm_obj_id_t *)(in_stack_00000008 + 8));
      pvVar5 = pvVar3 + 1;
      vm_val_t::set_obj(pvVar3,in_stack_00000010);
      pvVar3 = pvVar5 + 1;
      vm_val_t::set_obj(pvVar5,in_R8D);
      uVar6 = (uint)((ulong)(pvVar3 + 1) >> 0x20);
      vm_val_t::set_fnptr(pvVar3,(in_RCX->val).ofs);
      caller_ofs_01 = (uint)((ulong)in_RCX >> 0x20);
      CVmPoolInMem::get_ptr((CVmPoolInMem *)in_RDI,ofs);
      local_8 = do_call((CVmRun *)CONCAT44(in_ESI,in_EDX),caller_ofs_01,
                        (uchar *)CONCAT44(in_R8D,CONCAT22(in_R9W,in_stack_ffffffffffffffd8)),uVar6,
                        in_stack_ffffffffffffffc8);
      break;
    case 8:
      pCVar2 = vm_objp(0);
      iVar1 = (*pCVar2->_vptr_CVmObject[0xe])(pCVar2,0);
      if (iVar1 == 0) {
        iVar1 = CVmObjString::is_string_obj(0);
        if (iVar1 == 0) {
          err_throw(0);
        }
        push_obj((CVmRun *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff9c);
        local_8 = disp_string_val((CVmRun *)CONCAT44(in_ESI,in_EDX),(uint)((ulong)in_RCX >> 0x20),
                                  (vm_obj_id_t)in_RCX);
      }
      else {
        pvVar3 = CVmStack::push(5);
        pvVar5 = pvVar3 + 1;
        vm_val_t::set_propid(pvVar3,in_R9W);
        pvVar3 = pvVar5 + 1;
        vm_val_t::set_obj(pvVar5,*(vm_obj_id_t *)(in_stack_00000008 + 8));
        pvVar5 = pvVar3 + 1;
        vm_val_t::set_obj(pvVar3,in_stack_00000010);
        pvVar3 = pvVar5 + 1;
        vm_val_t::set_obj(pvVar5,in_R8D);
        uVar6 = (uint)((ulong)(pvVar3 + 1) >> 0x20);
        vm_val_t::set_obj(pvVar3,(in_RCX->val).obj);
        vm_val_t::set_obj(&local_48,(in_RCX->val).obj);
        local_8 = call_func_ptr_fr((CVmRun *)CONCAT44(in_ESI,in_EDX),in_RCX,in_R8D,
                                   in_stack_ffffffffffffffd0,uVar6);
      }
      break;
    case 9:
      call_bif((CVmRun *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,0);
      local_8 = entry_ptr_native_ + in_EDX;
    }
  }
  return local_8;
}

Assistant:

const uchar *CVmRun::eval_prop_val(VMG_ int found, uint caller_ofs,
                                   const vm_val_t *val,
                                   vm_obj_id_t self,
                                   vm_prop_id_t target_prop,
                                   const vm_val_t *orig_target_obj,
                                   vm_obj_id_t defining_obj,
                                   uint argc, const vm_rcdesc *rc)
{
    /* check whether or not the property is defined */
    if (found)
    {
        /* take appropriate action based on the datatype of the result */
        switch(val->typ)
        {
        case VM_CODEOFS:
            /* 
             *   It's a method - invoke the method.  This will set us up
             *   to start executing this new code, so there's nothing more
             *   we need to do here.  
             */

            /* push targetprop, targetobj, definingobj, self, and invokee */
            {
                vm_val_t *fp = push(5);
                (fp++)->set_propid(target_prop);
                (fp++)->set_obj(orig_target_obj->val.obj);
                (fp++)->set_obj(defining_obj);
                (fp++)->set_obj(self);
                (fp++)->set_fnptr(val->val.ofs);
            }

            /* call the function */
            return do_call(vmg_ caller_ofs,
                           (const uchar *)G_code_pool->get_ptr(val->val.ofs),
                           argc, rc);
            
        case VM_DSTRING:
            /* no arguments are allowed */
            if (argc != 0)
                err_throw(VMERR_WRONG_NUM_OF_ARGS);
            
            /* 
             *   it's a self-printing string - invoke the default string
             *   output function (this is effectively a do_call()) 
             */
            return disp_dstring(vmg_ val->val.ofs, caller_ofs, self);

        case VM_OBJX:
            /* 
             *   Execute-on-eval object.  If the value is an anonymous
             *   function or other invokable object, call it.  If it's a
             *   string, print it.  
             */
            if (vm_objp(vmg_ val->val.obj)->get_invoker(vmg_ 0))
            {
                /* push targetprop, targetobj, definingobj, self, invokee */
                vm_val_t *fp = push(5);
                (fp++)->set_propid(target_prop);
                (fp++)->set_obj(orig_target_obj->val.obj);
                (fp++)->set_obj(defining_obj);
                (fp++)->set_obj(self);
                (fp++)->set_obj(val->val.obj);

                /* convert to an ordinary anonymous function object */
                vm_val_t funcptr;
                funcptr.set_obj(val->val.obj);

                /* invoke it */
                return call_func_ptr_fr(vmg_ &funcptr, argc, 0, caller_ofs);
            }
            else if (CVmObjString::is_string_obj(vmg_ val->val.obj))
            {
                /* print the string */
                push_obj(vmg_ val->val.obj);
                return disp_string_val(vmg_ caller_ofs, self);
            }
            err_throw(VMERR_BAD_TYPE_CALL);

        case VM_BIFPTRX:
            /* Execute-on-eval built-in function.  Call the function. */
            call_bif(vmg_ val->val.bifptr.set_idx,
                     val->val.bifptr.func_idx, argc);

            /* resume execution where we left off */
            return entry_ptr_native_ + caller_ofs;
            
        default:
            /* for any other value, no arguments are allowed */
            if (argc != 0)
                err_throw(VMERR_WRONG_NUM_OF_ARGS);
            
            /* store the result in R0 */
            r0_ = *val;

            /* resume execution where we left off */
            return entry_ptr_native_ + caller_ofs;
        }
    }
    else
    {
        /* 
         *   the property or method is not defined - discard arguments and
         *   set R0 to nil
         */
        discard(argc);
        r0_.set_nil();

        /* resume execution where we left off */
        return entry_ptr_native_ + caller_ofs;
    }
}